

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::CopyImage::FunctionalTest::copyAndVerify
          (FunctionalTest *this,testCase *test_case,GLubyte **dst_pixels,GLubyte **src_pixels)

{
  ostringstream *poVar1;
  GLenum GVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  TestError *this_00;
  byte bVar7;
  GLuint *pGVar8;
  uint uVar9;
  uint uVar10;
  undefined8 uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uchar *tbs;
  bool bVar15;
  bool bVar16;
  Enum<int,_2UL> local_1f0;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  GVar2 = (test_case->m_dst).m_target;
  bVar3 = 0;
  if ((int)GVar2 < 0x8c1a) {
    if ((GVar2 == 0x806f) || (GVar2 == 0x8c18)) goto LAB_0087ddb7;
  }
  else if ((GVar2 == 0x8c1a) || ((GVar2 == 0x9102 || (GVar2 == 0x9009)))) {
LAB_0087ddb7:
    bVar3 = 1;
  }
  GVar2 = (test_case->m_src).m_target;
  bVar7 = 0;
  if ((int)GVar2 < 0x8c1a) {
    if ((GVar2 != 0x806f) && (GVar2 != 0x8c18)) goto LAB_0087ddf3;
  }
  else if ((GVar2 != 0x8c1a) && ((GVar2 != 0x9102 && (GVar2 != 0x9009)))) goto LAB_0087ddf3;
  bVar7 = 1;
LAB_0087ddf3:
  uVar9 = 0;
  if ((bVar3 | bVar7) == 1) {
    uVar11 = 0xc;
    uVar13 = 1;
    uVar10 = 0;
    if (bVar3 != bVar7) {
      uVar10 = (uint)bVar3;
      uVar9 = (uint)(bVar3 ^ 1);
      uVar13 = 0xc;
      uVar11 = 1;
    }
  }
  else {
    uVar11 = 1;
    uVar13 = 1;
    uVar10 = 0;
  }
  uVar14 = 0;
  tbs = (uchar *)0x0;
  bVar15 = false;
  uVar12 = 1;
  while( true ) {
    pGVar8 = &this->m_src_tex_name;
    if (this->m_rb_name != 0) {
      (**(code **)(lVar6 + 0x310))(this->m_src_tex_name,0xde1);
      pGVar8 = &this->m_rb_name;
    }
    (**(code **)(lVar6 + 0x310))
              (*pGVar8,(test_case->m_src).m_target,(test_case->m_src).m_level,test_case->m_src_x,
               test_case->m_src_y,tbs,this->m_dst_tex_name,(test_case->m_dst).m_target,
               (test_case->m_dst).m_level,test_case->m_dst_x,test_case->m_dst_y,uVar14,
               test_case->m_width,test_case->m_height,uVar11);
    iVar4 = (**(code **)(lVar6 + 0x800))();
    if ((iVar4 != 0) ||
       (uVar5 = verify(this,(EVP_PKEY_CTX *)test_case,(uchar *)(uVar14 & 0xffffffff),
                       (size_t)dst_pixels,tbs,(size_t)src_pixels), (uVar5 & 1) == 0)) break;
    bVar15 = uVar13 <= uVar12;
    tbs = tbs + uVar9;
    uVar14 = uVar14 + uVar10;
    bVar16 = uVar12 == uVar13;
    uVar12 = uVar12 + 1;
    if (bVar16) {
      return bVar15;
    }
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Failure. Targets src: ",0x16);
  local_1f0.m_value = (test_case->m_src).m_target;
  local_1f0.m_getName = glu::getTextureTargetName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", dst: ",7);
  local_1c0.m_value = (test_case->m_dst).m_target;
  local_1c0.m_getName = glu::getTextureTargetName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Levels src: ",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", dst: ",7);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Dimmensions src [",0x13);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], dst [",8);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]. Region [",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," x ",3);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," x ",3);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] from [",8);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] to [",6);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]. Format src: ",0xf);
  local_1d0.m_value = (test_case->m_src).m_internal_format;
  local_1d0.m_getName = glu::getInternalFormatParameterName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", dst: ",7);
  local_1e0.m_value = (test_case->m_dst).m_internal_format;
  local_1e0.m_getName = glu::getInternalFormatParameterName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (iVar4 == 0) {
    return bVar15;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Failed due to error: ",0x15)
  ;
  local_1f0.m_getName = glu::getErrorName;
  local_1f0.m_value = iVar4;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Copy operation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
             ,0xb7f);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool FunctionalTest::copyAndVerify(const testCase& test_case, const GLubyte** dst_pixels, const GLubyte** src_pixels)
{
	GLenum			 error				= GL_NO_ERROR;
	const Functions& gl					= m_context.getRenderContext().getFunctions();
	GLuint			 region_depth		= 1;
	GLuint			 dst_layer_step		= 0;
	const bool		 is_dst_multi_layer = Utils::isTargetMultilayer(test_case.m_dst.m_target);
	const bool		 is_src_multi_layer = Utils::isTargetMultilayer(test_case.m_src.m_target);
	bool			 result				= false;
	GLuint			 src_layer_step		= 0;
	GLuint			 n_layers			= 1;

	/* Configure layers */
	if ((true == is_dst_multi_layer) || (true == is_src_multi_layer))
	{
		if (is_src_multi_layer == is_dst_multi_layer)
		{
			/* Both objects are multilayered, copy all layers at once, verify at once */
			region_depth = FUNCTIONAL_TEST_N_LAYERS;
		}
		else if (true == is_dst_multi_layer)
		{
			/* Destination is multilayered, copy each layer separetly, verify at once */
			n_layers	   = FUNCTIONAL_TEST_N_LAYERS;
			dst_layer_step = 1;
		}
		else
		{
			/* Destination is multilayered, copy and verify each layer separetly */
			n_layers	   = FUNCTIONAL_TEST_N_LAYERS;
			src_layer_step = 1;
		}
	}

	/* Copy and verification */
	{
		GLuint dst_layer = 0;
		GLuint src_layer = 0;

		/* For each layer */
		for (GLuint layer = 0; layer < n_layers; ++layer)
		{
			if (0 == m_rb_name)
			{
				gl.copyImageSubData(m_src_tex_name, test_case.m_src.m_target, test_case.m_src.m_level,
									test_case.m_src_x, test_case.m_src_y, src_layer, m_dst_tex_name,
									test_case.m_dst.m_target, test_case.m_dst.m_level, test_case.m_dst_x,
									test_case.m_dst_y, dst_layer, test_case.m_width, test_case.m_height, region_depth);
			}
			else /* Copy from src to rb and from rb to dst */
			{
				/* Src and rb shares differs only on target */
				gl.copyImageSubData(m_src_tex_name, GL_TEXTURE_2D, test_case.m_src.m_level, test_case.m_src_x,
									test_case.m_src_y, src_layer, m_rb_name, test_case.m_src.m_target,
									test_case.m_src.m_level, test_case.m_src_x, test_case.m_src_y, src_layer,
									test_case.m_width, test_case.m_height, region_depth);

				gl.copyImageSubData(m_rb_name, test_case.m_src.m_target, test_case.m_src.m_level, test_case.m_src_x,
									test_case.m_src_y, src_layer, m_dst_tex_name, test_case.m_dst.m_target,
									test_case.m_dst.m_level, test_case.m_dst_x, test_case.m_dst_y, dst_layer,
									test_case.m_width, test_case.m_height, region_depth);
			}

			/* Verify generated error */
			error = gl.getError();

			if (GL_NO_ERROR == error)
			{
				/* Verify copy results */
				result = verify(test_case, dst_layer, dst_pixels, src_layer, src_pixels, region_depth);
			}

			if ((GL_NO_ERROR != error) || (false == result))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "Failure. Targets src: " << glu::getTextureTargetStr(test_case.m_src.m_target)
					<< ", dst: " << glu::getTextureTargetStr(test_case.m_dst.m_target)
					<< ". Levels src: " << test_case.m_src.m_level << ", dst: " << test_case.m_dst.m_level
					<< ". Dimmensions src [" << test_case.m_src.m_width << ", " << test_case.m_src.m_height
					<< "], dst [" << test_case.m_dst.m_width << ", " << test_case.m_dst.m_height << "]. Region ["
					<< test_case.m_width << " x " << test_case.m_height << " x " << region_depth << "] from ["
					<< test_case.m_src_x << ", " << test_case.m_src_y << ", " << src_layer << "] to ["
					<< test_case.m_dst_x << ", " << test_case.m_dst_y << ", " << dst_layer
					<< "]. Format src: " << glu::getInternalFormatParameterStr(test_case.m_src.m_internal_format)
					<< ", dst: " << glu::getInternalFormatParameterStr(test_case.m_dst.m_internal_format)
					<< tcu::TestLog::EndMessage;

				if (GL_NO_ERROR != error)
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message
														<< "Failed due to error: " << glu::getErrorStr(error)
														<< tcu::TestLog::EndMessage;

					TCU_FAIL("Copy operation failed");
				}

				return false;
			}

			/* Step one layer */
			dst_layer += dst_layer_step;
			src_layer += src_layer_step;
		}
	}

	return true;
}